

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

hwaddr arm_cpu_get_phys_page_attrs_debug_aarch64(CPUState *cs,vaddr addr,MemTxAttrs *attrs)

{
  _Bool _Var1;
  ARMMMUIdx mmu_idx;
  hwaddr hVar2;
  hwaddr phys_addr;
  int prot;
  target_ulong page_size;
  ARMMMUFaultInfo_conflict1 fi;
  
  fi.level = 0;
  fi.domain = 0;
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._27_5_ = 0;
  fi.type = ARMFault_None;
  fi._4_4_ = 0;
  fi.s2addr = 0;
  mmu_idx = arm_mmu_idx_aarch64((CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b));
  *attrs = (MemTxAttrs)0x0;
  _Var1 = get_phys_addr_aarch64
                    ((CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b),addr,MMU_DATA_LOAD,mmu_idx
                     ,&phys_addr,attrs,&prot,&page_size,&fi,(ARMCacheAttrs *)0x0);
  hVar2 = 0xffffffffffffffff;
  if (!_Var1) {
    hVar2 = phys_addr;
  }
  return hVar2;
}

Assistant:

hwaddr arm_cpu_get_phys_page_attrs_debug(CPUState *cs, vaddr addr,
                                         MemTxAttrs *attrs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    hwaddr phys_addr;
    target_ulong page_size;
    int prot;
    bool ret;
    ARMMMUFaultInfo fi = { 0 };
    ARMMMUIdx mmu_idx = arm_mmu_idx(env);

    *attrs = (MemTxAttrs) { 0 };

    ret = get_phys_addr(env, addr, 0, mmu_idx, &phys_addr,
                        attrs, &prot, &page_size, &fi, NULL);

    if (ret) {
        return -1;
    }
    return phys_addr;
}